

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

void __thiscall
gl4cts::FunctionObject::
tenary<tcu::Vector<double,_4>,_const_tcu::Vector<double,_4>_&,_const_tcu::Vector<double,_4>_&,_const_tcu::Vector<double,_4>_&>
::call(tenary<tcu::Vector<double,_4>,_const_tcu::Vector<double,_4>_&,_const_tcu::Vector<double,_4>_&,_const_tcu::Vector<double,_4>_&>
       *this,GLvoid *result_dst,GLvoid *argument_src)

{
  code *pcVar1;
  GLuint GVar2;
  GLuint GVar3;
  double local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  undefined1 local_b0 [8];
  Vector<double,_4> result;
  arg3T arg_3;
  arg2T arg_2;
  arg1T arg_1;
  functionPointer p_function;
  GLuint argument_3_offset;
  GLuint argument_2_offset;
  GLvoid *argument_src_local;
  GLvoid *result_dst_local;
  tenary<tcu::Vector<double,_4>,_const_tcu::Vector<double,_4>_&,_const_tcu::Vector<double,_4>_&,_const_tcu::Vector<double,_4>_&>
  *this_local;
  
  GVar2 = GPUShaderFP64Test10::functionObject::getArgumentOffset((functionObject *)this,1);
  GVar3 = GPUShaderFP64Test10::functionObject::getArgumentOffset((functionObject *)this,2);
  pcVar1 = (code *)(this->super_tenaryBase).super_functionObject.m_p_function;
  tcu::Vector<double,_4>::Vector((Vector<double,_4> *)(arg_2.m_data + 3));
  tcu::Vector<double,_4>::Vector((Vector<double,_4> *)(arg_3.m_data + 3));
  tcu::Vector<double,_4>::Vector((Vector<double,_4> *)(result.m_data + 3));
  tcu::Vector<double,_4>::Vector((Vector<double,_4> *)local_b0);
  unpack<tcu::Vector<double,_4>_>::get(argument_src,(Vector<double,_4> *)(arg_2.m_data + 3));
  unpack<tcu::Vector<double,_4>_>::get
            ((GLvoid *)((long)argument_src + (ulong)GVar2),(Vector<double,_4> *)(arg_3.m_data + 3));
  unpack<tcu::Vector<double,_4>_>::get
            ((GLvoid *)((long)argument_src + (ulong)GVar3),(Vector<double,_4> *)(result.m_data + 3))
  ;
  (*pcVar1)(&local_d0,arg_2.m_data + 3,arg_3.m_data + 3,result.m_data + 3);
  local_b0 = (undefined1  [8])local_d0;
  result.m_data[0] = local_c8;
  result.m_data[1] = local_c0;
  result.m_data[2] = local_b8;
  pack<tcu::Vector<double,_4>_>::set(result_dst,(Vector<double,_4> *)local_b0);
  return;
}

Assistant:

virtual void call(glw::GLvoid* result_dst, const glw::GLvoid* argument_src) const
	{
		const glw::GLuint argument_2_offset = getArgumentOffset(1);
		const glw::GLuint argument_3_offset = getArgumentOffset(2);

		functionPointer p_function = (functionPointer)m_p_function;

		arg1T arg_1;
		arg2T arg_2;
		arg3T arg_3;
		ResT  result;

		unpack<arg1T>::get(argument_src, arg_1);
		unpack<arg2T>::get((glw::GLubyte*)argument_src + argument_2_offset, arg_2);
		unpack<arg3T>::get((glw::GLubyte*)argument_src + argument_3_offset, arg_3);

		result = p_function(arg_1, arg_2, arg_3);

		pack<ResT>::set(result_dst, result);
	}